

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HessenbergDecomposition.h
# Opt level: O0

void Eigen::HessenbergDecomposition<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::_compute
               (MatrixType *matA,CoeffVectorType *hCoeffs,VectorType *temp)

{
  Scalar SVar1;
  Scalar SVar2;
  Index IVar3;
  Index IVar4;
  ScalarWithConstIfNotLvalue *pSVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  type local_2d8;
  ColXpr local_2d0;
  Type local_298;
  Type local_230;
  ColXpr local_1f8;
  Type local_1c0;
  Type local_158;
  ColXpr local_120;
  ColXpr local_e8;
  Type local_b0;
  Scalar local_48;
  Scalar h;
  RealScalar beta;
  Index remainingSize;
  Index i;
  Index n;
  VectorType *temp_local;
  CoeffVectorType *hCoeffs_local;
  MatrixType *matA_local;
  
  n = (Index)temp;
  temp_local = (VectorType *)hCoeffs;
  hCoeffs_local = (CoeffVectorType *)matA;
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&matA->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  IVar4 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)hCoeffs_local);
  if (IVar3 == IVar4) {
    i = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                  ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)hCoeffs_local);
    PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)n,i);
    for (remainingSize = 0; remainingSize < i + -1; remainingSize = remainingSize + 1) {
      beta = (RealScalar)((i - remainingSize) + -1);
      DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_e8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)hCoeffs_local,
                 remainingSize);
      DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
                (&local_b0,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &local_e8,(long)beta);
      MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>
      ::makeHouseholderInPlace
                ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
                  *)&local_b0,&local_48,&h);
      SVar2 = h;
      DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_120,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)hCoeffs_local,
                 remainingSize);
      pSVar5 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
               coeffRef((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                         *)&local_120,remainingSize + 1);
      SVar1 = local_48;
      *pSVar5 = SVar2;
      pSVar6 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeffRef
                         ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)temp_local,
                          remainingSize);
      *pSVar6 = SVar1;
      DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::bottomRightCorner<long,long>
                (&local_158,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)hCoeffs_local,
                 (long)beta,(long)beta);
      DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_1f8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)hCoeffs_local,
                 remainingSize);
      DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
                (&local_1c0,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &local_1f8,(long)beta + -1);
      pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::coeffRef
                         ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)n,0);
      MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
      applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,_1>>
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                 &local_158,&local_1c0,&local_48,pSVar7);
      DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rightCols<long>
                (&local_230,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)hCoeffs_local,
                 (long)beta);
      DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_2d0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)hCoeffs_local,
                 remainingSize);
      DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
                (&local_298,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &local_2d0,(long)beta + -1);
      local_2d8 = numext::conj<double>(&local_48);
      pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::coeffRef
                         ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)n,0);
      MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,true>>::
      applyHouseholderOnTheRight<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,_1>>
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>> *)
                 &local_230,&local_298,&local_2d8,pSVar7);
    }
    return;
  }
  __assert_fail("matA.rows()==matA.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Eigenvalues/./HessenbergDecomposition.h"
                ,0x128,
                "static void Eigen::HessenbergDecomposition<Eigen::Matrix<double, -1, -1>>::_compute(MatrixType &, CoeffVectorType &, VectorType &) [_MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

void HessenbergDecomposition<MatrixType>::_compute(MatrixType& matA, CoeffVectorType& hCoeffs, VectorType& temp)
{
  eigen_assert(matA.rows()==matA.cols());
  Index n = matA.rows();
  temp.resize(n);
  for (Index i = 0; i<n-1; ++i)
  {
    // let's consider the vector v = i-th column starting at position i+1
    Index remainingSize = n-i-1;
    RealScalar beta;
    Scalar h;
    matA.col(i).tail(remainingSize).makeHouseholderInPlace(h, beta);
    matA.col(i).coeffRef(i+1) = beta;
    hCoeffs.coeffRef(i) = h;

    // Apply similarity transformation to remaining columns,
    // i.e., compute A = H A H'

    // A = H A
    matA.bottomRightCorner(remainingSize, remainingSize)
        .applyHouseholderOnTheLeft(matA.col(i).tail(remainingSize-1), h, &temp.coeffRef(0));

    // A = A H'
    matA.rightCols(remainingSize)
        .applyHouseholderOnTheRight(matA.col(i).tail(remainingSize-1), numext::conj(h), &temp.coeffRef(0));
  }
}